

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O1

bool __thiscall SessionManager::haveROSession(SessionManager *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  Slot *this_00;
  CK_SLOT_ID CVar2;
  pointer ppSVar3;
  bool bVar4;
  MutexLocker lock;
  MutexLocker local_30;
  
  MutexLocker::MutexLocker(&local_30,this->sessionsMutex);
  for (ppSVar3 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar4 = ppSVar3 !=
              (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
              super__Vector_impl_data._M_finish, bVar4; ppSVar3 = ppSVar3 + 1) {
    if (*ppSVar3 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar3);
      CVar2 = Slot::getSlotID(this_00);
      if (CVar2 == slotID) {
        bVar1 = Session::isRW(*ppSVar3);
        if (!bVar1) break;
      }
    }
  }
  MutexLocker::~MutexLocker(&local_30);
  return bVar4;
}

Assistant:

bool SessionManager::haveROSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() != slotID) continue;

		if ((*i)->isRW() == false) return true;
	}

	return false;
}